

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O1

void __thiscall ForbiddenPointFinder::clear(ForbiddenPointFinder *this)

{
  Stone *pSVar1;
  long lVar2;
  long lVar3;
  
  this->nForbiddenPoints = 0;
  pSVar1 = this->cBoard[0] + 0x10;
  lVar2 = 0;
  do {
    this->cBoard[0][lVar2] = Wall;
    this->cBoard[0x10][lVar2] = Wall;
    (*(Stone (*) [17])(pSVar1 + -0x10))[0] = Wall;
    *pSVar1 = Wall;
    lVar2 = lVar2 + 1;
    pSVar1 = pSVar1 + 0x11;
  } while (lVar2 != 0x11);
  pSVar1 = this->cBoard[1] + 1;
  lVar2 = 1;
  do {
    lVar3 = 0;
    do {
      pSVar1[lVar3] = Empty;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xf);
    lVar2 = lVar2 + 1;
    pSVar1 = pSVar1 + 0x11;
  } while (lVar2 != 0x10);
  return;
}

Assistant:

void ForbiddenPointFinder::clear() {
    nForbiddenPoints = 0;

    for (int i = 0; i < BoardSize + 2; i++) {
        cBoard[0][i] = Stone ::Wall;
        cBoard[(BoardSize + 1)][i] = Stone ::Wall;
        cBoard[i][0] = Stone ::Wall;
        cBoard[i][(BoardSize + 1)] = Stone ::Wall;
    }

    for (int i = 1; i <= BoardSize; i++)
        for (int j = 1; j <= BoardSize; j++)
            cBoard[i][j] = Stone::Empty;
}